

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeNativePtr
          (string *__return_storage_ptr__,CppGenerator *this,string *type,FieldDef *field,
          bool is_constructor)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  string *psVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  psVar4 = PtrType_abi_cxx11_(this,field);
  iVar3 = std::__cxx11::string::compare((char *)psVar4);
  if (iVar3 == 0) {
    if (is_constructor) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + type->_M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar4);
    psVar8 = &(this->opts_).super_IDLOptions.cpp_object_api_pointer_type;
    if (iVar3 != 0) {
      psVar8 = psVar4;
    }
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + psVar8->_M_string_length);
    std::__cxx11::string::append((char *)local_68);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_68,(ulong)(type->_M_dataplus)._M_p);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_38 = *plVar6;
      lStack_30 = plVar5[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar6;
      local_48 = (long *)*plVar5;
    }
    local_40 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeNativePtr(const std::string &type, const FieldDef *field,
                               bool is_constructor) {
    auto &ptr_type = PtrType(field);
    if (ptr_type != "naked") {
      return (ptr_type != "default_ptr_type"
                  ? ptr_type
                  : opts_.cpp_object_api_pointer_type) +
             "<" + type + ">";
    } else if (is_constructor) {
      return "";
    } else {
      return type + " *";
    }
  }